

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_o3lyp.c
# Opt level: O3

void x3lyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  dVar5 = get_ext_param(p,ext_params,3);
  dVar6 = get_ext_param(p,ext_params,4);
  pdVar1 = p->mix_coef;
  *pdVar1 = (1.0 - dVar2) - (dVar5 + dVar6) * dVar3;
  pdVar1[1] = dVar5 * dVar3;
  pdVar1[2] = dVar6 * dVar3;
  pdVar1[3] = 1.0 - dVar4;
  pdVar1[4] = dVar4;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
x3lyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ax, ac, ax1, ax2;

  assert(p != NULL);
  a0    = get_ext_param(p, ext_params, 0);
  ax    = get_ext_param(p, ext_params, 1);
  ac    = get_ext_param(p, ext_params, 2);
  ax1   = get_ext_param(p, ext_params, 3);
  ax2   = get_ext_param(p, ext_params, 4);

  p->mix_coef[0] = 1.0 - a0 - ax*(ax1 + ax2);
  p->mix_coef[1] = ax*ax1;
  p->mix_coef[2] = ax*ax2;
  p->mix_coef[3] = 1.0 - ac;
  p->mix_coef[4] = ac;

  p->cam_alpha = a0;
}